

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O1

void __thiscall sc_core::sc_in<bool>::end_of_elaboration(sc_in<bool> *this)

{
  sc_trace_params *psVar1;
  sc_trace_file *tf;
  int iVar2;
  pointer ppsVar3;
  long *plVar4;
  bool *object;
  long lVar5;
  
  if (this->m_traces != (sc_trace_params_vec *)0x0) {
    ppsVar3 = (this->m_traces->
              super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_traces->
                                super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3) >> 3))
    {
      lVar5 = 0;
      do {
        psVar1 = ppsVar3[lVar5];
        iVar2 = (*(this->
                  super_sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>).
                  super_sc_port_b<sc_core::sc_signal_in_if<bool>_>.super_sc_port_base.
                  super_sc_object._vptr_sc_object[0xf])(this);
        plVar4 = (long *)__dynamic_cast(iVar2,&sc_interface::typeinfo,
                                        &sc_signal_in_if<bool>::typeinfo,0xffffffffffffffff);
        tf = psVar1->tf;
        object = (bool *)(**(code **)(*plVar4 + 0x38))(plVar4);
        sc_core::sc_trace(tf,object,&psVar1->name);
        lVar5 = lVar5 + 1;
        ppsVar3 = (this->m_traces->
                  super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar5 < (int)((ulong)((long)(this->m_traces->
                                           super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppsVar3) >> 3));
    }
    remove_traces(this);
    return;
  }
  return;
}

Assistant:

void
sc_in<bool>::end_of_elaboration()
{
    if( m_traces != 0 ) {
	for( int i = 0; i < (int)m_traces->size(); ++ i ) {
	    sc_trace_params* p = (*m_traces)[i];
	    in_if_type* iface = dynamic_cast<in_if_type*>( get_interface() );
	    sc_trace( p->tf, iface->read(), p->name );
	}
	remove_traces();
    }
}